

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CoverCrossSymbol::serializeTo(CoverCrossSymbol *this,ASTSerializer *serializer)

{
  pointer ppCVar1;
  size_t sVar2;
  Symbol *value;
  Expression *__n;
  CoverageOptionSetter *opt;
  long lVar3;
  pointer this_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  
  name._M_str = "targets";
  name._M_len = 7;
  ASTSerializer::startArray(serializer,name);
  ppCVar1 = (this->targets)._M_ptr;
  sVar2 = (this->targets)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    value = *(Symbol **)((long)ppCVar1 + lVar3);
    ASTSerializer::startObject(serializer);
    name_00._M_str = "coverpoint";
    name_00._M_len = 10;
    ASTSerializer::writeLink(serializer,name_00,value);
    ASTSerializer::endObject(serializer);
  }
  ASTSerializer::endArray(serializer);
  if ((this->options)._M_extent._M_extent_value != 0) {
    name_01._M_str = "options";
    name_01._M_len = 7;
    ASTSerializer::startArray(serializer,name_01);
    this_00 = (this->options)._M_ptr;
    for (lVar3 = (this->options)._M_extent._M_extent_value * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18
        ) {
      ASTSerializer::startObject(serializer);
      CoverageOptionSetter::serializeTo(this_00,serializer);
      ASTSerializer::endObject(serializer);
      this_00 = this_00 + 1;
    }
    ASTSerializer::endArray(serializer);
  }
  __n = getIffExpr(this);
  if (__n != (Expression *)0x0) {
    ASTSerializer::write(serializer,3,"iff",(size_t)__n);
    return;
  }
  return;
}

Assistant:

void CoverCrossSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("targets");
    for (auto target : targets) {
        serializer.startObject();
        serializer.writeLink("coverpoint", *target);
        serializer.endObject();
    }
    serializer.endArray();

    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options) {
            serializer.startObject();
            opt.serializeTo(serializer);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (auto iff = getIffExpr())
        serializer.write("iff", *iff);
}